

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall duckdb::EnumTypeInfo::Copy(EnumTypeInfo *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar2;
  _func_int **local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  LogicalType local_98;
  Vector values_insert_order_copy;
  
  LogicalType::LogicalType(&local_98,VARCHAR);
  Vector::Vector(&values_insert_order_copy,&local_98,false,false,0);
  LogicalType::~LogicalType(&local_98);
  Vector::Reference(&values_insert_order_copy,(Vector *)(in_RSI + 0x38));
  make_shared_ptr<duckdb::EnumTypeInfo,duckdb::Vector&,unsigned_long_const&>
            ((Vector *)&local_a8,(unsigned_long *)&values_insert_order_copy);
  _Var1._M_pi = _Stack_a0._M_pi;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = local_a8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  local_a8 = (_func_int **)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  Vector::~Vector(&values_insert_order_copy);
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> EnumTypeInfo::Copy() const {
	Vector values_insert_order_copy(LogicalType::VARCHAR, false, false, 0);
	values_insert_order_copy.Reference(values_insert_order);
	return make_shared_ptr<EnumTypeInfo>(values_insert_order_copy, dict_size);
}